

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O3

optional<unsigned_long> __thiscall
gmlc::containers::
DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>::
insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
          (DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
           *this,string_view searchValue1,InterfaceHandle *searchValue2,ValueFederate **data,
          InterfaceHandle *data_1,basic_string_view<char,_std::char_traits<char>_> *data_2,
          basic_string_view<char,_std::char_traits<char>_> *data_3,
          basic_string_view<char,_std::char_traits<char>_> *data_4)

{
  int iVar1;
  _Storage<unsigned_long,_true> _Var2;
  iterator iVar3;
  DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
  *pDVar4;
  _Storage<unsigned_long,_true> *p_Var5;
  DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
  *pDVar6;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  long lVar8;
  optional<unsigned_long> oVar9;
  _Storage<unsigned_long,_true> local_40;
  key_type local_38;
  
  local_38._M_str = searchValue1._M_str;
  local_38._M_len = searchValue1._M_len;
  iVar3 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(this + 0x30),&local_38);
  if ((iVar3.
       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
       ._M_cur != (__node_type *)0x0) &&
     (pDVar4 = *(DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
                 **)(this + 0xa8),
     pDVar4 != (DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
                *)0x0)) {
    iVar1 = searchValue2->hid;
    pDVar6 = this + 0xa0;
    do {
      if (iVar1 <= *(int *)(pDVar4 + 0x20)) {
        pDVar6 = pDVar4;
      }
      pDVar4 = *(DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
                 **)(pDVar4 + (ulong)(*(int *)(pDVar4 + 0x20) < iVar1) * 8 + 0x10);
    } while (pDVar4 != (DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
                        *)0x0);
    if ((pDVar6 != this + 0xa0) && (*(int *)(pDVar6 + 0x20) <= iVar1)) {
      uVar7 = 0;
      local_40._M_value = 0;
      goto LAB_001f3cb7;
    }
  }
  local_40 = *(_Storage<unsigned_long,_true> *)this;
  StableBlockVector<helics::Publication,5u,std::allocator<helics::Publication>>::
  emplace_back<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((StableBlockVector<helics::Publication,5u,std::allocator<helics::Publication>> *)this,
             data,data_1,data_2,data_3,data_4);
  StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            ((StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>> *)
             (this + 0x68),&local_38);
  if ((long)*(int *)(this + 0x80) == 0) {
    lVar8 = *(long *)(*(long *)(this + 0x70) + -8 + (*(ulong *)(this + 0x68) >> 5) * 8) + 0x3e0;
  }
  else {
    lVar8 = *(long *)(*(long *)(this + 0x70) + (long)*(int *)(this + 0x7c) * 8) +
            (long)*(int *)(this + 0x80) * 0x20 + -0x20;
  }
  std::
  _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string&,unsigned_long&>
            ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)(this + 0x30),lVar8,&local_40);
  _Var2 = local_40;
  p_Var5 = (_Storage<unsigned_long,_true> *)
           std::
           map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
           ::operator[]((map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
                         *)(this + 0x98),searchValue2);
  p_Var5->_M_value = (unsigned_long)_Var2;
  uVar7 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_001f3cb7:
  oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar7;
  oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_40._M_value;
  return (optional<unsigned_long>)
         oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            std::string_view searchValue1,
            const searchType2& searchValue2,
            Us&&... data)
        {
            auto fnd = lookup1.find(searchValue1);
            if (fnd != lookup1.end()) {
                auto fnd2 = lookup2.find(searchValue2);
                if (fnd2 != lookup2.end()) {
                    return std::nullopt;
                }
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            names.emplace_back(searchValue1);
            lookup1.emplace(names.back(), index);
            lookup2[searchValue2] = index;
            return index;
        }